

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_smsb.hpp
# Opt level: O1

void __thiscall
ans_smsb_encode<320U>::encode_symbol
          (ans_smsb_encode<320U> *this,uint64_t *state,uint32_t sym,uint8_t **out_u8)

{
  pointer peVar1;
  uint uVar2;
  pointer peVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint16_t uVar6;
  
  uVar6 = ans_smsb_mapping_and_exceptions(sym,out_u8);
  peVar3 = (this->table).super__Vector_base<enc_entry_smsb,_std::allocator<enc_entry_smsb>_>._M_impl
           .super__Vector_impl_data._M_start;
  peVar1 = peVar3 + uVar6;
  uVar4 = *state;
  if (peVar3[uVar6].sym_upper_bound <= uVar4) {
    puVar5 = *out_u8;
    *(int *)puVar5 = (int)uVar4;
    *out_u8 = puVar5 + 4;
    *state = uVar4 >> 0x20;
  }
  uVar2 = peVar1->freq;
  *state = (ulong)peVar1->base + *state % (ulong)uVar2 + (*state / (ulong)uVar2) * this->frame_size;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint32_t sym, uint8_t*& out_u8)
    {
        auto mapped_sym = ans_smsb_mapping_and_exceptions(sym, out_u8);
        const auto& e = table[mapped_sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }